

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O2

void __thiscall
net_tests::anon_unknown_17::V2TransportTester::ReceiveGarbage(V2TransportTester *this)

{
  pointer puVar1;
  const_iterator __first;
  bool bVar2;
  iterator in_R8;
  iterator in_R9;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  const_string msg;
  const_string file;
  check_type cVar5;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  Span<const_std::byte> term_span;
  array<std::byte,_16UL> *local_70;
  element_type *local_68;
  shared_count sStack_60;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar4 = -0x10;
  for (lVar3 = 0; lVar3 != 0x1000; lVar3 = lVar3 + 1) {
    local_48 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
    ;
    local_40 = "";
    local_58 = &boost::unit_test::basic_cstring<char_const>::null;
    local_50 = &boost::unit_test::basic_cstring<char_const>::null;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    file.m_end = (iterator)0x4e1;
    file.m_begin = (iterator)&local_48;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
    local_70 = (array<std::byte,_16UL> *)
               CONCAT71(local_70._1_7_,
                        lVar3 + 0x10U <=
                        (ulong)((long)(this->m_received).
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(this->m_received).
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_start));
    local_68 = (element_type *)0x0;
    sStack_60.pi_ = (sp_counted_base *)0x0;
    local_a0 = "m_received.size() >= garblen + BIP324Cipher::GARBAGE_TERMINATOR_LEN";
    local_98 = "";
    term_span.m_size = term_span.m_size & 0xffffffffffffff00;
    term_span.m_data = (byte *)&PTR__lazy_ostream_0113a070;
    local_b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
    ;
    local_a8 = "";
    in_R8 = (iterator)0x2;
    in_R9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_70,(lazy_ostream *)&term_span,2,0,WARN,_cVar5,
               (size_t)&local_b0,0x4e1);
    boost::detail::shared_count::~shared_count(&sStack_60);
    term_span.m_data =
         (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
         _M_impl.super__Vector_impl_data._M_start + lVar3;
    term_span.m_size = 0x10;
    local_68 = (element_type *)0x10;
    local_70 = &(this->m_cipher).m_recv_garbage_terminator;
    bVar2 = std::ranges::__equal_fn::
            operator()<Span<const_std::byte>_&,_Span<const_std::byte>,_std::ranges::equal_to,_std::identity,_std::identity>
                      ((__equal_fn *)&std::ranges::equal,(lazy_ostream *)&term_span,
                       (assertion_result *)&local_70);
    if (bVar2) break;
    lVar4 = lVar4 + -1;
  }
  puVar1 = (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->m_recv_garbage,puVar1,
             puVar1 + lVar3);
  __first._M_current =
       (this->m_received).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::erase
            (&this->m_received,__first,(const_iterator)(__first._M_current + -lVar4));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void ReceiveGarbage()
    {
        // Figure out the garbage length.
        size_t garblen;
        for (garblen = 0; garblen <= V2Transport::MAX_GARBAGE_LEN; ++garblen) {
            BOOST_REQUIRE(m_received.size() >= garblen + BIP324Cipher::GARBAGE_TERMINATOR_LEN);
            auto term_span = MakeByteSpan(Span{m_received}.subspan(garblen, BIP324Cipher::GARBAGE_TERMINATOR_LEN));
            if (std::ranges::equal(term_span, m_cipher.GetReceiveGarbageTerminator())) break;
        }
        // Copy the garbage to a buffer.
        m_recv_garbage.assign(m_received.begin(), m_received.begin() + garblen);
        // Strip garbage + garbage terminator off the front of the receive buffer.
        m_received.erase(m_received.begin(), m_received.begin() + garblen + BIP324Cipher::GARBAGE_TERMINATOR_LEN);
    }